

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterFwd.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  undefined7 in_register_00000009;
  stringstream out;
  string sStack_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])
            (&local_1e8,this,opt,CONCAT71(in_register_00000009,is_positional) & 0xffffffff);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&local_208,this,opt);
  ::std::operator+(&local_1c8,&local_1e8,&local_208);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&sStack_228,this,opt);
  detail::format_help(local_198,&local_1c8,&sStack_228,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&sStack_228);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string make_option(const Option *opt, bool is_positional) const {
        std::stringstream out;
        detail::format_help(
            out, make_option_name(opt, is_positional) + make_option_opts(opt), make_option_desc(opt), column_width_);
        return out.str();
    }